

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

void __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *next;
  ItemBlock *i_1;
  Item *end;
  Item *i;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Future<void>::Private::ThreadPool::ThreadContext::~ThreadContext((ThreadContext *)(end + 1));
  }
  pIVar1 = this->blocks;
  while (next = pIVar1, next != (ItemBlock *)0x0) {
    pIVar1 = next->next;
    if (next != (ItemBlock *)0x0) {
      operator_delete__(next);
    }
  }
  return;
}

Assistant:

~PoolList()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      ((T*)(i + 1))->~T();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }